

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_BoyerMooreFind.h
# Opt level: O1

size_t axl::sl::
       BoyerMooreTextFindBase<axl::sl::BoyerMooreTextDetailsBase<axl::sl::BoyerMooreSkipTablesBase<wchar_t>,_axl::enc::Utf8,_axl::enc::Utf8Decoder,_false,_axl::enc::ToCaseFolded,_true,_false,_256UL,_256UL>_>
       ::locateBinOffset(BoyerMooreTextState *state,size_t i,char *p,char *end)

{
  size_t *psVar1;
  C *src;
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  size_t sVar5;
  char *buffer;
  size_t pos;
  ConvertLengthResult CVar6;
  ConvertLengthResult CVar7;
  DecoderState decoderState;
  DecoderState decoderState_1;
  DecoderState local_54;
  char *local_50;
  char *local_48;
  size_t local_40;
  DecoderState local_34;
  
  sVar5 = (state->m_binTail).super_CircularBufferBase<char>.m_length;
  psVar1 = &(state->super_BoyerMooreStateBase<wchar_t>).m_tail.m_length;
  pos = i - *psVar1;
  if (i < *psVar1) {
    local_54 = 0;
    src = (state->m_binTail).super_CircularBufferBase<char>.m_buffer.
          super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>.m_p;
    sVar2 = (state->m_binTail).super_CircularBufferBase<char>.m_front;
    sVar3 = (state->m_binTail).super_CircularBufferBase<char>.m_back;
    local_50 = p;
    local_48 = end;
    local_40 = sVar5;
    if ((long)sVar2 < (long)sVar3) {
      CVar6 = enc::Locate<axl::enc::Utf8,_axl::enc::Utf8Decoder>::locate
                        (&local_54,i,src + sVar2,src + sVar3);
    }
    else {
      CVar6 = enc::Locate<axl::enc::Utf8,_axl::enc::Utf8Decoder>::locate
                        (&local_54,i,src + sVar2,
                         src + (state->m_binTail).super_CircularBufferBase<char>.m_buffer.
                               super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>.m_count);
      uVar4 = CVar6.m_dstLength;
      if (uVar4 <= i && i - uVar4 != 0) {
        CVar7 = enc::Locate<axl::enc::Utf8,_axl::enc::Utf8Decoder>::locate
                          (&local_54,i - uVar4,src,src + sVar3);
        CVar6.m_srcLength = CVar6.m_srcLength + CVar7.m_srcLength;
        CVar6.m_dstLength = uVar4 + CVar7.m_dstLength;
      }
    }
    sVar5 = CVar6.m_srcLength;
    if (CVar6.m_dstLength < i) {
      CVar6 = enc::Locate<axl::enc::Utf8,_axl::enc::Utf8Decoder>::locate
                        (&local_54,pos,local_50,local_48);
      sVar5 = CVar6.m_srcLength + local_40;
    }
  }
  else {
    local_34 = state->m_decoderState;
    CVar6 = enc::Locate<axl::enc::Utf8,_axl::enc::Utf8Decoder>::locate(&local_34,pos,p,end);
    sVar5 = CVar6.m_srcLength + sVar5;
  }
  return sVar5;
}

Assistant:

void
	clear() {
		m_pattern.clear();
		m_skipTables.clear();
	}